

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O2

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::operator*
          (Matrix<long_double> *this,Matrix<long_double> *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pvVar4;
  long lVar5;
  Matrix<long_double> *this_00;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  bool bVar12;
  
  if (this->M == other->N) {
    this_00 = (Matrix<long_double> *)operator_new(0x30);
    Matrix(this_00,this->N,other->M);
    sVar1 = this->N;
    for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
      sVar2 = other->M;
      sVar3 = this->M;
      for (sVar7 = 0; sVar7 != sVar2; sVar7 = sVar7 + 1) {
        pvVar4 = (this->matrix).
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = sVar7 * 0x10;
        lVar9 = 0;
        lVar10 = 0;
        sVar11 = sVar3;
        while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
          lVar5 = *(long *)&(this_00->matrix).
                            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar6].
                            super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                            super__Vector_impl_data;
          *(longdouble *)(lVar5 + lVar8) =
               *(longdouble *)(lVar5 + lVar8) +
               *(longdouble *)
                (*(long *)((long)&(((other->matrix).
                                    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<long_double,_std::allocator<long_double>_>).
                                  _M_impl.super__Vector_impl_data + lVar10) + lVar8) *
               *(longdouble *)
                (*(long *)&pvVar4[sVar6].
                           super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                           super__Vector_impl_data + lVar9);
          lVar10 = lVar10 + 0x18;
          lVar9 = lVar9 + 0x10;
        }
      }
    }
  }
  else {
    this_00 = (Matrix<long_double> *)0x0;
  }
  return this_00;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::operator*(
        const neural_networks::utilities::Matrix<T> *other) const {
    if(M == other -> N) {
        neural_networks::utilities::Matrix<T> *C  = new Matrix(N, other -> M);
        if(!C) {
            std::cerr << "Matrix Multiplication: Unable to allocate new matrix product\n";
            return nullptr;
        }
        size_t i, j;
        register size_t k;
        for(i = 0; i < N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                for(k = 0; k < M; ++k) {
                    C -> matrix[i][j] += matrix[i][k] * other -> matrix[k][j]; }
            }
        }
        return C;

    } else {
        return nullptr;
    }
}